

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall
booster::log::message::message(message *this,level_type l,char *m,char *name,int line)

{
  ostringstream *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_R8D;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  locale local_40 [8];
  
  *in_RDI = in_ESI;
  *(undefined8 *)(in_RDI + 2) = in_RDX;
  *(undefined8 *)(in_RDI + 4) = in_RCX;
  in_RDI[6] = in_R8D;
  this_00 = (ostringstream *)operator_new(0x178);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::unique_ptr<std::__cxx11::ostringstream,std::default_delete<std::__cxx11::ostringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::ostringstream>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  copy_ptr<booster::log::message::data>::copy_ptr
            ((copy_ptr<booster::log::message::data> *)(in_RDI + 10));
  std::
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x22085c);
  std::locale::classic();
  std::ios::imbue(local_40);
  std::locale::~locale(local_40);
  return;
}

Assistant:

message::message(level_type l,char const *m,char const *name,int line) :
		level_(l),
		module_(m),
		file_name_(name),
		file_line_(line),
		message_(new std::ostringstream())
	{
		message_->imbue(std::locale::classic());
	}